

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cctest.h
# Opt level: O2

void CheckEqualsHelper(char *file,int line,char *expected_source,double expected,char *value_source,
                      double value)

{
  undefined4 in_register_00000034;
  
  if (((expected != value) || (NAN(expected) || NAN(value))) && ((!NAN(expected) || (!NAN(value)))))
  {
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %.30e\n#  Found:    %.30e\n",
           "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-strtod.cc"
           ,(ulong)file & 0xffffffff,CONCAT44(in_register_00000034,line),expected_source);
    abort();
  }
  return;
}

Assistant:

static inline void CheckEqualsHelper(const char* file, int line,
                                     const char* expected_source,
                                     double expected,
                                     const char* value_source,
                                     double value) {
  // If expected and value are NaNs then expected != value.
  if (expected != value && (expected == expected || value == value)) {
    printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n"
           "#  Expected: %.30e\n"
           "#  Found:    %.30e\n",
           file, line, expected_source, value_source, expected, value);
    abort();
  }
}